

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

float nifti_mat33_colnorm(mat33 A)

{
  float fVar1;
  float fVar2;
  float in_stack_00000008;
  float in_stack_0000000c;
  float r3;
  float r2;
  float r1;
  
  r3 = ABS(in_stack_00000008) + ABS(A.m[0][1]) + ABS(A.m[1][1]);
  fVar1 = ABS(in_stack_0000000c) + ABS(A.m[0][2]) + ABS(A.m[1][2]);
  fVar2 = ABS(A.m[0][0]) + ABS(A.m[1][0]) + ABS(A.m[2][0]);
  if (r3 < fVar1) {
    r3 = fVar1;
  }
  if (r3 < fVar2) {
    r3 = fVar2;
  }
  return r3;
}

Assistant:

float nifti_mat33_colnorm( mat33 A )  /* max column norm of 3x3 matrix */
{
   float r1,r2,r3 ;

   r1 = (float)( fabs(A.m[0][0])+fabs(A.m[1][0])+fabs(A.m[2][0]) ) ;
   r2 = (float)( fabs(A.m[0][1])+fabs(A.m[1][1])+fabs(A.m[2][1]) ) ;
   r3 = (float)( fabs(A.m[0][2])+fabs(A.m[1][2])+fabs(A.m[2][2]) ) ;
   if( r1 < r2 ) r1 = r2 ;
   if( r1 < r3 ) r1 = r3 ;
   return r1 ;
}